

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_6)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_class_72_9_b858679e func;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3f woRender;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  RayDifferential *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  MediumHandle *in_R8;
  undefined1 auVar17 [64];
  Point2f PVar18;
  undefined8 uVar21;
  undefined8 uVar22;
  SurfaceInteraction *pSVar23;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [64];
  Vector3<float> VVar27;
  SampledSpectrum SVar28;
  SampledSpectrum SVar29;
  BSDF bsdf;
  SurfaceInteraction *isect;
  LightHandle *light;
  const_iterator __end4;
  const_iterator __begin4;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range4;
  RNG rng;
  Float tMax;
  bool terminated;
  bool scattered;
  optional<pbrt::ShapeIntersection> si;
  int numScatters;
  SampledSpectrum beta;
  SampledSpectrum L;
  undefined1 auVar30 [16];
  undefined1 in_stack_fffffffffffffa88 [64];
  SampledWavelengths *in_stack_fffffffffffffb00;
  SampledWavelengths *pSVar31;
  ShapeIntersection *in_stack_fffffffffffffb08;
  ShapeIntersection *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  MediumHandle *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  SampledWavelengths *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  Point2f *in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  Point2f *in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  Float in_stack_fffffffffffffb74;
  SurfaceInteraction *this_00;
  float fVar32;
  undefined4 uStack_46c;
  BSDFSample local_314;
  undefined1 local_2f0 [80];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  ShapeIntersection *local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  reference local_1f8;
  LightHandle *local_1f0;
  const_iterator in_stack_fffffffffffffe18;
  CameraHandle *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar33;
  RayDifferential *in_stack_fffffffffffffe30;
  SurfaceInteraction *in_stack_fffffffffffffe38;
  SamplerHandle *in_stack_fffffffffffffe50;
  byte local_162;
  byte local_161;
  optional local_160 [268];
  SamplerHandle local_54 [3];
  MediumHandle *local_38;
  undefined8 local_28;
  array<float,_4> local_10;
  undefined1 auVar24 [56];
  undefined1 auVar26 [56];
  
  local_38 = in_R8;
  local_28 = in_RDX;
  SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._4_4_);
  SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._4_4_);
  local_54[0].
  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits._0_4_ = 0;
  SampledWavelengths::TerminateSecondary(in_stack_fffffffffffffa88._8_8_);
  SVar29.values.values[2] = (float)(int)in_stack_fffffffffffffb38;
  SVar29.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  SVar29.values.values[0] = (float)(int)in_stack_fffffffffffffb48;
  SVar29.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  do {
    auVar19 = ZEXT464(0x7f800000);
    Integrator::Intersect
              (in_stack_fffffffffffffa88._32_8_,in_stack_fffffffffffffa88._24_8_,
               in_stack_fffffffffffffa88._20_4_);
    local_161 = 0;
    local_162 = 0;
    bVar16 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x20));
    auVar30 = in_stack_fffffffffffffa88._0_16_;
    pSVar31 = in_stack_fffffffffffffb00;
    if (bVar16) {
      bVar16 = pstd::optional::operator_cast_to_bool(local_160);
      if (bVar16) {
        pstd::optional<pbrt::ShapeIntersection>::operator->
                  ((optional<pbrt::ShapeIntersection> *)0x7e6aa4);
      }
      SamplerHandle::Get1D(auVar30._8_8_);
      Hash<float>(0.0);
      SamplerHandle::Get1D(auVar30._8_8_);
      Hash<float>(0.0);
      RNG::RNG(auVar30._8_8_,auVar30._0_8_,0x7e6b6b);
      in_stack_fffffffffffffe38 = (SurfaceInteraction *)&local_10;
      in_stack_fffffffffffffe50 = local_54;
      auVar19._8_8_ = in_stack_fffffffffffffe38;
      auVar19._0_8_ = in_RCX;
      auVar19._16_8_ = local_28;
      auVar19._24_8_ = &local_162;
      auVar19._32_8_ = in_stack_fffffffffffffe50;
      auVar19._40_8_ = in_RDI;
      auVar19._48_8_ =
           (undefined1 *)
           ((long)&local_54[0].
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   .bits + 4);
      auVar19._56_8_ = in_RSI;
      auVar17 = vmovdqu64_avx512f(auVar19);
      in_stack_fffffffffffffa88 = vmovdqu64_avx512f(auVar17);
      auVar19 = ZEXT1664(SUB6416(ZEXT464(0),0));
      in_ZMM1 = ZEXT1664(auVar17._0_16_);
      func.L = (SampledSpectrum *)SVar29.values.values._8_8_;
      func.sampler = (SamplerHandle *)in_stack_fffffffffffffb30;
      func.lambda = in_stack_fffffffffffffb40;
      func.terminated = (bool *)SVar29.values.values._0_8_;
      func.numScatters = (int *)in_stack_fffffffffffffb50;
      func.this._0_4_ = in_stack_fffffffffffffb58;
      func.this._4_4_ = in_stack_fffffffffffffb5c;
      func.beta = (SampledSpectrum *)in_stack_fffffffffffffb60;
      func.ray._0_4_ = in_stack_fffffffffffffb68;
      func.ray._4_4_ = in_stack_fffffffffffffb6c;
      func.scattered._0_4_ = in_stack_fffffffffffffb70;
      func.scattered._4_4_ = in_stack_fffffffffffffb74;
      in_stack_fffffffffffffe30 = in_RCX;
      MediumHandle::
      SampleTmaj<pbrt::SimpleVolPathIntegrator::Li(pbrt::RayDifferential,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::ScratchBuffer&,pbrt::VisibleSurface*)const::__0>
                (in_stack_fffffffffffffb20,
                 (Ray *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                 (Float)((ulong)in_stack_fffffffffffffb10 >> 0x20),(RNG *)in_stack_fffffffffffffb08,
                 in_stack_fffffffffffffb00,func);
      pSVar31 = in_stack_fffffffffffffb00;
    }
    in_stack_fffffffffffffb00 = pSVar31;
    if ((local_162 & 1) == 0) {
      if ((local_161 & 1) == 0) {
        bVar16 = pstd::optional::operator_cast_to_bool(local_160);
        auVar24 = auVar19._8_56_;
        if (bVar16) {
          local_240 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                ((optional<pbrt::ShapeIntersection> *)0x7e6eab);
          VVar27 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa88._8_8_);
          local_288 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar17._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar17._8_56_ = auVar24;
          pSVar23 = (SurfaceInteraction *)0x0;
          uVar21 = auVar24._0_8_;
          local_290 = vmovlpd_avx(auVar17._0_16_);
          local_280 = local_290;
          local_278 = local_288;
          SVar29 = SurfaceInteraction::Le
                             (in_stack_fffffffffffffa88._56_8_,in_stack_fffffffffffffa88._48_8_,
                              in_stack_fffffffffffffa88._40_8_);
          auVar8._8_8_ = uVar21;
          auVar8._0_8_ = SVar29.values.values._8_8_;
          auVar9._8_8_ = pSVar23;
          auVar9._0_8_ = SVar29.values.values._0_8_;
          local_270 = vmovlpd_avx(auVar9);
          local_268 = vmovlpd_avx(auVar8);
          SVar28 = SampledSpectrum::operator*
                             (in_stack_fffffffffffffa88._16_8_,in_stack_fffffffffffffa88._8_8_);
          fVar32 = (float)uVar21;
          uStack_46c = (undefined4)((ulong)uVar21 >> 0x20);
          auVar6._8_8_ = pSVar23;
          auVar6._0_8_ = SVar28.values.values._8_8_;
          auVar7._8_4_ = fVar32;
          auVar7._0_8_ = SVar28.values.values._0_8_;
          auVar7._12_4_ = uStack_46c;
          in_stack_fffffffffffffb50 = auVar7._8_8_;
          local_260 = vmovlpd_avx(auVar7);
          local_258 = vmovlpd_avx(auVar6);
          this_00 = pSVar23;
          SVar29 = SampledWavelengths::PDF(in_stack_fffffffffffffa88._8_8_);
          in_stack_fffffffffffffb58 = SVar29.values.values[2];
          in_stack_fffffffffffffb5c = SVar29.values.values[3];
          in_stack_fffffffffffffb68 = SVar29.values.values[0];
          in_stack_fffffffffffffb6c = SVar29.values.values[1];
          in_stack_fffffffffffffb70 = SUB84(pSVar23,0);
          in_stack_fffffffffffffb74 = (Float)((ulong)pSVar23 >> 0x20);
          auVar4._8_8_ = in_stack_fffffffffffffb50;
          auVar4._0_8_ = SVar29.values.values._8_8_;
          auVar5._8_4_ = in_stack_fffffffffffffb70;
          auVar5._0_8_ = SVar29.values.values._0_8_;
          auVar5._12_4_ = in_stack_fffffffffffffb74;
          in_stack_fffffffffffffb00 = auVar5._8_8_;
          local_2a0 = vmovlpd_avx(auVar5);
          local_298 = vmovlpd_avx(auVar4);
          in_stack_fffffffffffffb60 = in_stack_fffffffffffffb50;
          SVar29 = SafeDiv(in_stack_fffffffffffffa88._24_8_,in_stack_fffffffffffffa88._16_8_);
          auVar30._8_8_ = in_stack_fffffffffffffb00;
          auVar30._0_8_ = SVar29.values.values._8_8_;
          auVar3._8_8_ = in_stack_fffffffffffffb50;
          auVar3._0_8_ = SVar29.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar3);
          local_250 = vmovlpd_avx(auVar3);
          local_248 = vmovlpd_avx(auVar30);
          in_stack_fffffffffffffb40 = in_stack_fffffffffffffb00;
          SampledSpectrum::operator+=
                    (in_stack_fffffffffffffa88._24_8_,in_stack_fffffffffffffa88._16_8_);
          in_stack_fffffffffffffb30 = local_28;
          CameraHandle::CameraHandle
                    (in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
          auVar24 = in_stack_fffffffffffffa88._8_56_;
          in_stack_fffffffffffffb20 = local_38;
          SamplerHandle::SamplerHandle
                    (in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
          in_stack_fffffffffffffa88._8_56_ = auVar24;
          in_stack_fffffffffffffa88._0_8_ = local_2f0;
          SurfaceInteraction::GetBSDF
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     (SampledWavelengths *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     in_stack_fffffffffffffe20,(ScratchBuffer *)in_stack_fffffffffffffe18._M_current
                     ,in_stack_fffffffffffffe50);
          in_stack_fffffffffffffb1f = BSDF::operator_cast_to_bool((BSDF *)0x7e713b);
          if (!(bool)in_stack_fffffffffffffb1f) {
            in_stack_fffffffffffffb08 = local_240;
            in_stack_fffffffffffffb10 =
                 pstd::optional<pbrt::ShapeIntersection>::operator->
                           ((optional<pbrt::ShapeIntersection> *)0x7e716e);
            SurfaceInteraction::SkipIntersection
                      (this_00,SVar28.values.values._8_8_,in_stack_fffffffffffffb74);
            in_stack_fffffffffffffb00 = pSVar31;
            goto LAB_007e72cf;
          }
          VVar27 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa88._8_8_);
          auVar2._8_8_ = in_stack_fffffffffffffb00;
          auVar2._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          vmovlpd_avx(auVar2);
          SamplerHandle::Get1D(in_stack_fffffffffffffa88._8_8_);
          PVar18 = SamplerHandle::Get2D(in_stack_fffffffffffffa88._0_8_);
          auVar1._8_8_ = extraout_XMM0_Qb;
          auVar1._0_4_ = PVar18.super_Tuple2<pbrt::Point2,_float>.x;
          auVar1._4_4_ = PVar18.super_Tuple2<pbrt::Point2,_float>.y;
          vmovlpd_avx(auVar1);
          in_ZMM1 = ZEXT464(0);
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar32;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)SVar28.values.values._0_8_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)SVar28.values.values._0_8_ >> 0x20);
          BSDF::Sample_f((BSDF *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         woRender,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60,
                         (TransportMode)in_stack_fffffffffffffb5c,
                         (BxDFReflTransFlags)in_stack_fffffffffffffb58);
          bVar16 = BSDFSample::operator_cast_to_bool(&local_314);
          if (bVar16) {
            ErrorExit<>(in_stack_fffffffffffffa88._56_8_);
          }
          iVar33 = 3;
        }
        else {
          in_stack_fffffffffffffe20 = (CameraHandle *)(in_RDI + 0x28);
          in_stack_fffffffffffffe18 =
               std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                         (in_stack_fffffffffffffa88._0_8_);
          local_1f0 = (LightHandle *)
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                                (in_stack_fffffffffffffa88._0_8_);
          while( true ) {
            auVar24 = auVar19._8_56_;
            bVar16 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
            auVar26 = in_ZMM1._8_56_;
            if (!bVar16) break;
            local_1f8 = __gnu_cxx::
                        __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        ::operator*((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                                     *)&stack0xfffffffffffffe18);
            SVar28 = LightHandle::Le(in_stack_fffffffffffffa88._40_8_,
                                     in_stack_fffffffffffffa88._32_8_,
                                     in_stack_fffffffffffffa88._24_8_);
            auVar25._0_8_ = SVar28.values.values._8_8_;
            auVar25._8_56_ = auVar26;
            auVar20._0_8_ = SVar28.values.values._0_8_;
            auVar20._8_56_ = auVar24;
            uVar21 = auVar26._0_8_;
            uVar22 = auVar24._0_8_;
            local_228 = vmovlpd_avx(auVar20._0_16_);
            local_220 = vmovlpd_avx(auVar25._0_16_);
            SVar28 = SampledSpectrum::operator*
                               (in_stack_fffffffffffffa88._16_8_,in_stack_fffffffffffffa88._8_8_);
            auVar14._8_8_ = uVar22;
            auVar14._0_8_ = SVar28.values.values._8_8_;
            auVar15._8_8_ = uVar21;
            auVar15._0_8_ = SVar28.values.values._0_8_;
            local_218 = vmovlpd_avx(auVar15);
            local_210 = vmovlpd_avx(auVar14);
            SVar28 = SampledWavelengths::PDF(in_stack_fffffffffffffa88._8_8_);
            auVar12._8_8_ = uVar21;
            auVar12._0_8_ = SVar28.values.values._8_8_;
            auVar13._8_8_ = uVar22;
            auVar13._0_8_ = SVar28.values.values._0_8_;
            local_238 = vmovlpd_avx(auVar13);
            local_230 = vmovlpd_avx(auVar12);
            SVar28 = SafeDiv(in_stack_fffffffffffffa88._24_8_,in_stack_fffffffffffffa88._16_8_);
            auVar10._8_8_ = uVar22;
            auVar10._0_8_ = SVar28.values.values._8_8_;
            auVar19 = ZEXT1664(auVar10);
            auVar11._8_8_ = uVar21;
            auVar11._0_8_ = SVar28.values.values._0_8_;
            in_ZMM1 = ZEXT1664(auVar11);
            local_208 = vmovlpd_avx(auVar11);
            local_200 = vmovlpd_avx(auVar10);
            SampledSpectrum::operator+=
                      (in_stack_fffffffffffffa88._24_8_,in_stack_fffffffffffffa88._16_8_);
            __gnu_cxx::
            __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
            ::operator++((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                          *)&stack0xfffffffffffffe18);
          }
          iVar33 = 1;
          in_stack_fffffffffffffb00 = pSVar31;
        }
      }
      else {
LAB_007e72cf:
        iVar33 = 0;
      }
    }
    else {
      iVar33 = 3;
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x7e72e7);
    if (iVar33 != 0) {
      return (array<float,_4>)(array<float,_4>)local_10.values;
    }
    in_stack_fffffffffffffe2c = 0;
  } while( true );
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            ScratchBuffer &scratchBuffer,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    lambda.TerminateSecondary();
    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering for _SimpleVolPathIntegrator_
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(ray, tMax, rng, lambda, [&](const MediumSample &ms) {
                // Update delta-tracking estimator for path sample
                if (!ms.intr)
                    return false;
                const MediumInteraction &intr = *ms.intr;
                const SampledSpectrum &sigma_a = intr.sigma_a, &sigma_s = intr.sigma_s;
                // Compute medium event probabilities for interaction
                Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta-tracking
                Float u = sampler.Get1D();
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, u);
                if (mode == 0) {
                    // Handle absorption event for delta-tracking
                    // absorbed; done
                    L += SafeDiv(intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle scattering event for delta-tracking
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }
                    Vector3f wi = SampleUniformSphere(sampler.Get2D());
                    beta *= intr.phase.p(-ray.d, wi) / UniformSpherePDF();
                    ray = intr.SpawnRay(wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta-tracking
                    // null -- keep going...
                    return true;
                }
            });
        }
        if (terminated)
            break;
        if (!scattered) {
            // Add emission to un-scattered ray
            if (!si) {
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
                return L;
            }
            SurfaceInteraction &isect = si->intr;
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

            // Handle surface intersection for _SimpleVolPathIntegrator_
            BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
            if (!bsdf)
                isect.SkipIntersection(&ray, si->tHit);
            else if (bsdf.Sample_f(-ray.d, sampler.Get1D(), sampler.Get2D()))
                ErrorExit(
                    "SimpleVolPathIntegrator doesn't support scattering from surfaces");
            else
                break;
        }
    }
    return L;
}